

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.h
# Opt level: O3

char * __thiscall
google::protobuf::internal::ParseContext::ParseGroup
          (ParseContext *this,MessageLite *msg,char *ptr,uint32_t tag)

{
  uint32_t uVar1;
  char *pcVar2;
  char *pcVar3;
  int iVar4;
  int iVar5;
  
  iVar4 = this->depth_;
  this->depth_ = iVar4 + -1;
  if (iVar4 < 1) {
LAB_0028c1ef:
    pcVar3 = (char *)0x0;
  }
  else {
    iVar5 = this->group_depth_;
    this->group_depth_ = iVar5 + 1;
    pcVar2 = MessageLite::_InternalParse(msg,ptr,this);
    if (pcVar2 == (char *)0x0) {
      iVar5 = this->group_depth_ + -1;
      iVar4 = this->depth_ + 1;
    }
    else {
      if (iVar4 + -1 != this->depth_) {
        ParseGroup();
      }
      if (iVar5 + 1 != this->group_depth_) {
        ParseGroup();
        goto LAB_0028c1ef;
      }
    }
    this->group_depth_ = iVar5;
    this->depth_ = iVar4;
    uVar1 = (this->super_EpsCopyInputStream).last_tag_minus_1_;
    (this->super_EpsCopyInputStream).last_tag_minus_1_ = 0;
    pcVar3 = (char *)0x0;
    if (uVar1 == tag) {
      pcVar3 = pcVar2;
    }
  }
  return pcVar3;
}

Assistant:

[[nodiscard]] PROTOBUF_NDEBUG_INLINE const char* ParseGroup(MessageLite* msg,
                                                              const char* ptr,
                                                              uint32_t tag) {
    if (--depth_ < 0) return nullptr;
    group_depth_++;
    auto old_depth = depth_;
    auto old_group_depth = group_depth_;
    ptr = msg->_InternalParse(ptr, this);
    if (ptr != nullptr) {
      ABSL_DCHECK_EQ(old_depth, depth_);
      ABSL_DCHECK_EQ(old_group_depth, group_depth_);
    }
    group_depth_--;
    depth_++;
    if (ABSL_PREDICT_FALSE(!ConsumeEndGroup(tag))) return nullptr;
    return ptr;
  }